

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O3

void __thiscall
tcu::Exception::Exception(Exception *this,char *message,char *expr,char *file,int line)

{
  size_t sVar1;
  undefined4 in_register_00000084;
  int in_R9D;
  char *__s;
  string local_40;
  
  formatError_abi_cxx11_
            (&local_40,(tcu *)message,expr,file,(char *)CONCAT44(in_register_00000084,line),in_R9D);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__Exception_003e5e08;
  __s = "Runtime check failed";
  if (message != (char *)0x0) {
    __s = message;
  }
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_message,__s,__s + sVar1);
  return;
}

Assistant:

Exception::Exception (const char* message, const char* expr, const char* file, int line)
	: std::runtime_error(formatError(message, expr, file, line))
	, m_message			(message ? message : "Runtime check failed")
{
}